

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

uint32 __thiscall
Js::SimpleTypeHandler<1UL>::ExtractSlotInfo_TTD
          (SimpleTypeHandler<1UL> *this,SnapHandlerPropertyEntry *entryInfo,
          ThreadContext *threadContext,SlabAllocator *alloc)

{
  uint uVar1;
  PropertyId pid;
  PropertyRecord *this_00;
  uint local_30;
  uint32 index;
  uint32 plength;
  SlabAllocator *alloc_local;
  ThreadContext *threadContext_local;
  SnapHandlerPropertyEntry *entryInfo_local;
  SimpleTypeHandler<1UL> *this_local;
  
  uVar1 = this->propertyCount;
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                        (&this->descriptors[local_30].Id);
    pid = PropertyRecord::GetPropertyId(this_00);
    TTD::NSSnapType::ExtractSnapPropertyEntryInfo
              (entryInfo + local_30,pid,this->descriptors[local_30].field_1.Attributes,Data);
  }
  return uVar1;
}

Assistant:

uint32 SimpleTypeHandler<size>::ExtractSlotInfo_TTD(TTD::NSSnapType::SnapHandlerPropertyEntry* entryInfo, ThreadContext* threadContext, TTD::SlabAllocator& alloc) const
    {
        uint32 plength = this->propertyCount;

        for(uint32 index = 0; index < plength; ++index)
        {
            TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo + index, this->descriptors[index].Id->GetPropertyId(), this->descriptors[index].Attributes, TTD::NSSnapType::SnapEntryDataKindTag::Data);
        }

        return plength;
    }